

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::min(quadratic_cost_type<float> *this,int n)

{
  type pfVar1;
  float *pfVar2;
  type piVar3;
  type pqVar4;
  unique_ptr<float[],_std::default_delete<float[]>_> *this_00;
  unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  *this_01;
  float fVar5;
  float local_2c;
  int local_28;
  int local_24;
  int e;
  int i_1;
  float local_18;
  int i;
  float min;
  int n_local;
  quadratic_cost_type<float> *this_local;
  
  i = n;
  _min = this;
  local_18 = std::numeric_limits<float>::max();
  for (i_1 = 0; i_1 != i; i_1 = i_1 + 1) {
    pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)i_1);
    if ((*pfVar1 != 0.0) || (NAN(*pfVar1))) {
      this_00 = &this->linear_elements;
      pfVar1 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (this_00,(long)i_1);
      fVar5 = *pfVar1;
      std::abs((int)this_00);
      e = (int)fVar5;
      pfVar2 = std::min<float>(&local_18,(float *)&e);
      local_18 = *pfVar2;
    }
  }
  local_24 = 0;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)i);
  local_28 = *piVar3;
  for (; local_24 != local_28; local_24 = local_24 + 1) {
    pqVar4 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)local_24);
    if ((pqVar4->factor != 0.0) || (NAN(pqVar4->factor))) {
      this_01 = &this->quadratic_elements;
      pqVar4 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ::operator[](this_01,(long)local_24);
      fVar5 = pqVar4->factor;
      std::abs((int)this_01);
      local_2c = fVar5;
      pfVar2 = std::min<float>(&local_18,&local_2c);
      local_18 = *pfVar2;
    }
  }
  return local_18;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }